

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O3

REF_STATUS ref_swap_local_cell(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  uint uVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_ADJ pRVar4;
  REF_ADJ_ITEM pRVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  pRVar2 = ref_grid->node;
  *allowed = 0;
  if (-1 < node0) {
    pRVar3 = ref_grid->cell[3];
    pRVar4 = pRVar3->ref_adj;
    if ((node0 < pRVar4->nnode) && (lVar6 = (long)pRVar4->first[(uint)node0], lVar6 != -1)) {
      pRVar5 = pRVar4->item + lVar6;
      uVar1 = pRVar3->node_per;
      while( true ) {
        if (0 < (int)uVar1) {
          lVar7 = (long)pRVar3->size_per * (long)pRVar5->ref;
          uVar8 = 0;
          do {
            if (pRVar3->c2n[lVar7 + uVar8] == node1) {
              uVar9 = 0;
              do {
                if (pRVar2->ref_mpi->id != pRVar2->part[pRVar3->c2n[lVar7 + uVar9]]) {
                  return 0;
                }
                uVar9 = uVar9 + 1;
              } while (uVar1 != uVar9);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar1);
        }
        pRVar5 = pRVar3->ref_adj->item;
        lVar6 = (long)pRVar5[(int)lVar6].next;
        if (lVar6 == -1) break;
        pRVar5 = pRVar5 + lVar6;
      }
    }
  }
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_swap_local_cell(REF_GRID ref_grid, REF_INT node0,
                                       REF_INT node1, REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, search_node, test_node;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (search_node = 0; search_node < ref_cell_node_per(ref_cell);
         search_node++) {
      if (node1 == ref_cell_c2n(ref_cell, search_node, cell)) {
        for (test_node = 0; test_node < ref_cell_node_per(ref_cell);
             test_node++) {
          if (!ref_node_owned(ref_node,
                              ref_cell_c2n(ref_cell, test_node, cell))) {
            return REF_SUCCESS;
          }
        }
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}